

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::default_mt::impl::coop_repo_t::wait_for_start_deregistration
          (coop_repo_t *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &(this->super_coop_repository_basis_t).m_coop_operations_lock;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((this->super_coop_repository_basis_t).m_deregistration_started == false) {
    do {
      std::condition_variable::wait((unique_lock *)&this->m_deregistration_started_cond);
    } while ((this->super_coop_repository_basis_t).m_deregistration_started != true);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void
coop_repo_t::wait_for_start_deregistration()
{
	std::unique_lock< std::mutex > lck( this->lock() );

	m_deregistration_started_cond.wait( lck,
			[this] { return m_deregistration_started; } );
}